

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lockstep_scheduler.cpp
# Opt level: O2

void __thiscall LockstepScheduler::set_absolute_time(LockstepScheduler *this,uint64_t time_us)

{
  iterator __position;
  shared_ptr<LockstepScheduler::TimedWait> temp_timed_wait;
  unique_lock<std::mutex> lock_timed_waits;
  __shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2> local_50;
  unique_lock<std::mutex> local_40;
  
  LOCK();
  (this->time_us_).super___atomic_base<unsigned_long>._M_i = time_us;
  UNLOCK();
  std::unique_lock<std::mutex>::unique_lock(&local_40,&this->timed_waits_mutex_);
  __position._M_current =
       (this->timed_waits_).
       super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
       ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (__position._M_current ==
        (this->timed_waits_).
        super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
      return;
    }
    std::__shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_50,
               &(__position._M_current)->
                super___shared_ptr<LockstepScheduler::TimedWait,_(__gnu_cxx::_Lock_policy)2>);
    if ((local_50._M_ptr)->done == true) {
      __position = std::
                   vector<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
                   ::erase(&this->timed_waits_,(const_iterator)__position._M_current);
    }
    else {
      if (((local_50._M_ptr)->time_us <= time_us) && ((local_50._M_ptr)->timeout == false)) {
        (local_50._M_ptr)->timeout = true;
        this->timed_waits_iterator_invalidated_ = false;
        pthread_mutex_lock((pthread_mutex_t *)(local_50._M_ptr)->passed_lock);
        pthread_cond_broadcast((pthread_cond_t *)(local_50._M_ptr)->passed_cond);
        pthread_mutex_unlock((pthread_mutex_t *)(local_50._M_ptr)->passed_lock);
        if (this->timed_waits_iterator_invalidated_ == true) {
          __position._M_current =
               (this->timed_waits_).
               super__Vector_base<std::shared_ptr<LockstepScheduler::TimedWait>,_std::allocator<std::shared_ptr<LockstepScheduler::TimedWait>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          goto LAB_00107de0;
        }
      }
      __position._M_current = __position._M_current + 1;
    }
LAB_00107de0:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_50._M_refcount);
  } while( true );
}

Assistant:

void LockstepScheduler::set_absolute_time(uint64_t time_us)
{
    time_us_ = time_us;

    {
        std::unique_lock<std::mutex> lock_timed_waits(timed_waits_mutex_);

        auto it = std::begin(timed_waits_);
        while (it != std::end(timed_waits_)) {

            std::shared_ptr<TimedWait> temp_timed_wait = *it;

            // Clean up the ones that are already done from last iteration.
            if (temp_timed_wait->done) {
                it = timed_waits_.erase(it);
                continue;
            }

            if (temp_timed_wait->time_us <= time_us &&
                    !temp_timed_wait->timeout &&
                    !temp_timed_wait->done) {
                temp_timed_wait->timeout = true;
                // We are abusing the condition here to signal that the time
                // has passed.
                timed_waits_iterator_invalidated_ = false;
                pthread_mutex_lock(temp_timed_wait->passed_lock);
                pthread_cond_broadcast(temp_timed_wait->passed_cond);
                pthread_mutex_unlock(temp_timed_wait->passed_lock);
                if (timed_waits_iterator_invalidated_) {
                    // The vector might have changed, we need to start from the
                    // beginning.
                    it = std::begin(timed_waits_);
                    continue;
                }
            }
            ++it;
        }
    }
}